

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::IntegerFunctionCase::iterate(IntegerFunctionCase *this)

{
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *symbols;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *symbols_00;
  int inNdx;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  MessageBuilder *this_00;
  char *description;
  int inNdx_1;
  int *value;
  long lVar5;
  vector<void_*,_std::allocator<void_*>_> curInputPtr;
  vector<void_*,_std::allocator<void_*>_> curOutputPtr;
  vector<void_*,_std::allocator<void_*>_> inputPointers;
  vector<void_*,_std::allocator<void_*>_> outputPointers;
  vector<int,_std::allocator<int>_> outScalarSizes;
  vector<int,_std::allocator<int>_> inScalarSizes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputData;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputData;
  _Vector_base<void_*,_std::allocator<void_*>_> local_2a8;
  _Vector_base<void_*,_std::allocator<void_*>_> local_290;
  _Vector_base<void_*,_std::allocator<void_*>_> local_278;
  VarValue local_260 [2];
  _Vector_base<void_*,_std::allocator<void_*>_> local_240;
  ostringstream *local_228;
  string *local_220;
  int *local_218;
  _Vector_base<int,_std::allocator<int>_> local_210;
  _Vector_base<int,_std::allocator<int>_> local_1f8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1e0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  
  symbols = &(this->m_spec).inputs;
  iVar1 = computeTotalScalarSize(symbols);
  symbols_00 = &(this->m_spec).outputs;
  iVar2 = computeTotalScalarSize(symbols_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1c8,
             (long)(iVar1 * this->m_numValues),(allocator_type *)local_1b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e0,
             (long)(iVar2 * this->m_numValues),(allocator_type *)local_1b0);
  value = &this->m_numValues;
  getInputOutputPointers
            ((vector<void_*,_std::allocator<void_*>_> *)&local_278,symbols,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1c8,*value);
  getInputOutputPointers
            ((vector<void_*,_std::allocator<void_*>_> *)&local_240,symbols_00,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e0,*value);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(ulong)(uint)this->m_numValues,local_278._M_impl.super__Vector_impl_data._M_start)
  ;
  (*this->m_executor->_vptr_ShaderExecutor[5])();
  (*this->m_executor->_vptr_ShaderExecutor[6])
            (this->m_executor,(ulong)(uint)this->m_numValues,
             local_278._M_impl.super__Vector_impl_data._M_start,
             local_240._M_impl.super__Vector_impl_data._M_start);
  getScalarSizes((vector<int,_std::allocator<int>_> *)&local_1f8,symbols);
  getScalarSizes((vector<int,_std::allocator<int>_> *)&local_210,symbols_00);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)&local_2a8,
             (long)local_278._M_impl.super__Vector_impl_data._M_finish -
             (long)local_278._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)local_1b0);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)&local_290,
             (long)local_240._M_impl.super__Vector_impl_data._M_finish -
             (long)local_240._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)local_1b0);
  local_228 = &this->m_failMsg;
  local_220 = (string *)
              &(this->m_failMsg).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  iVar1 = 0;
  local_218 = value;
  for (iVar2 = 0; iVar2 < *value; iVar2 = iVar2 + 1) {
    for (lVar4 = 0;
        lVar4 < (int)((ulong)((long)local_2a8._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_2a8._M_impl.super__Vector_impl_data._M_start) >> 3);
        lVar4 = lVar4 + 1) {
      local_2a8._M_impl.super__Vector_impl_data._M_start[lVar4] =
           (void *)((long)(local_1f8._M_impl.super__Vector_impl_data._M_start[lVar4] * iVar2) * 4 +
                   (long)local_278._M_impl.super__Vector_impl_data._M_start[lVar4]);
    }
    lVar4 = 0;
    while( true ) {
      if ((int)((ulong)((long)local_290._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_290._M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar4)
      break;
      local_290._M_impl.super__Vector_impl_data._M_start[lVar4] =
           (void *)((long)(local_210._M_impl.super__Vector_impl_data._M_start[lVar4] * iVar2) * 4 +
                   (long)local_240._M_impl.super__Vector_impl_data._M_start[lVar4]);
      lVar4 = lVar4 + 1;
    }
    iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                      (this,local_2a8._M_impl.super__Vector_impl_data._M_start);
    if ((char)iVar3 == '\0') {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"ERROR: comparison failed for value ");
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar2);
      std::operator<<(&local_1a8,":\n  ");
      std::__cxx11::stringbuf::str();
      std::operator<<(&local_1a8,(string *)local_260);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)local_260);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"  inputs:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      lVar5 = 0;
      for (lVar4 = 0;
          lVar4 < (int)((ulong)((long)local_2a8._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2a8._M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar4 = lVar4 + 1) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"    ");
        std::operator<<(&local_1a8,
                        (string *)
                        ((long)&(((symbols->
                                  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                _M_p + lVar5));
        std::operator<<(&local_1a8," = ");
        local_260[0].type =
             (VarType *)
             ((long)&(((symbols->
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       )._M_impl.super__Vector_impl_data._M_start)->varType).m_type + lVar5);
        local_260[0].value = local_2a8._M_impl.super__Vector_impl_data._M_start[lVar4];
        tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,local_260);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        lVar5 = lVar5 + 0x38;
      }
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"  outputs:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      lVar5 = 0;
      for (lVar4 = 0;
          lVar4 < (int)((ulong)((long)local_290._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_290._M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar4 = lVar4 + 1) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"    ");
        std::operator<<(&local_1a8,
                        (string *)
                        ((long)&(((symbols_00->
                                  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                _M_p + lVar5));
        std::operator<<(&local_1a8," = ");
        local_260[0].type =
             (VarType *)
             ((long)&(((symbols_00->
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       )._M_impl.super__Vector_impl_data._M_start)->varType).m_type + lVar5);
        local_260[0].value = local_290._M_impl.super__Vector_impl_data._M_start[lVar4];
        tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,local_260);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        lVar5 = lVar5 + 0x38;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)local_260);
      std::__cxx11::stringbuf::str(local_220);
      value = local_218;
      std::__cxx11::string::~string((string *)local_1b0);
      std::ios::clear((int)(local_228->super_basic_ostream<char,_std::char_traits<char>_>).
                           _vptr_basic_ostream[-3] + (int)local_228);
      iVar1 = iVar1 + 1;
    }
  }
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::ostream::operator<<((ostringstream *)&local_1a8,*value - iVar1);
  std::operator<<(&local_1a8," / ");
  this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
  std::operator<<(&(this_00->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  " values passed");
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  description = "Pass";
  if (iVar1 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(iVar1 != 0),
             description);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_290);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_2a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_210);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1f8);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_240);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_278);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1e0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1c8);
  return STOP;
}

Assistant:

IntegerFunctionCase::IterateResult IntegerFunctionCase::iterate (void)
{
	const int				numInputScalars			= computeTotalScalarSize(m_spec.inputs);
	const int				numOutputScalars		= computeTotalScalarSize(m_spec.outputs);
	vector<deUint32>		inputData				(numInputScalars * m_numValues);
	vector<deUint32>		outputData				(numOutputScalars * m_numValues);
	const vector<void*>		inputPointers			= getInputOutputPointers(m_spec.inputs, inputData, m_numValues);
	const vector<void*>		outputPointers			= getInputOutputPointers(m_spec.outputs, outputData, m_numValues);

	// Initialize input data.
	getInputValues(m_numValues, &inputPointers[0]);

	// Execute shader.
	m_executor->useProgram();
	m_executor->execute(m_numValues, &inputPointers[0], &outputPointers[0]);

	// Compare results.
	{
		const vector<int>		inScalarSizes		= getScalarSizes(m_spec.inputs);
		const vector<int>		outScalarSizes		= getScalarSizes(m_spec.outputs);
		vector<void*>			curInputPtr			(inputPointers.size());
		vector<void*>			curOutputPtr		(outputPointers.size());
		int						numFailed			= 0;

		for (int valNdx = 0; valNdx < m_numValues; valNdx++)
		{
			// Set up pointers for comparison.
			for (int inNdx = 0; inNdx < (int)curInputPtr.size(); ++inNdx)
				curInputPtr[inNdx] = (deUint32*)inputPointers[inNdx] + inScalarSizes[inNdx]*valNdx;

			for (int outNdx = 0; outNdx < (int)curOutputPtr.size(); ++outNdx)
				curOutputPtr[outNdx] = (deUint32*)outputPointers[outNdx] + outScalarSizes[outNdx]*valNdx;

			if (!compare(&curInputPtr[0], &curOutputPtr[0]))
			{
				// \todo [2013-08-08 pyry] We probably want to log reference value as well?

				m_testCtx.getLog() << TestLog::Message << "ERROR: comparison failed for value " << valNdx << ":\n  " << m_failMsg.str() << TestLog::EndMessage;

				m_testCtx.getLog() << TestLog::Message << "  inputs:" << TestLog::EndMessage;
				for (int inNdx = 0; inNdx < (int)curInputPtr.size(); inNdx++)
					m_testCtx.getLog() << TestLog::Message << "    " << m_spec.inputs[inNdx].name << " = "
														   << VarValue(m_spec.inputs[inNdx].varType, curInputPtr[inNdx])
									   << TestLog::EndMessage;

				m_testCtx.getLog() << TestLog::Message << "  outputs:" << TestLog::EndMessage;
				for (int outNdx = 0; outNdx < (int)curOutputPtr.size(); outNdx++)
					m_testCtx.getLog() << TestLog::Message << "    " << m_spec.outputs[outNdx].name << " = "
														   << VarValue(m_spec.outputs[outNdx].varType, curOutputPtr[outNdx])
									   << TestLog::EndMessage;

				m_failMsg.str("");
				m_failMsg.clear();
				numFailed += 1;
			}
		}

		m_testCtx.getLog() << TestLog::Message << (m_numValues - numFailed) << " / " << m_numValues << " values passed" << TestLog::EndMessage;

		m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								numFailed == 0 ? "Pass"					: "Result comparison failed");
	}

	return STOP;
}